

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  uint uVar58;
  Scene *pSVar59;
  long lVar60;
  ulong uVar61;
  ulong *puVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  bool bVar66;
  bool bVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  float fVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar122 [64];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_ce0 [16];
  undefined1 (*local_cd0) [16];
  ulong local_cc8;
  undefined1 local_cc0 [32];
  RTCFilterFunctionNArguments local_c90;
  undefined1 local_c60 [32];
  Scene *local_c40;
  undefined1 auStack_c38 [24];
  long local_c20;
  undefined1 auStack_c18 [24];
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined4 local_bb0;
  undefined4 uStack_bac;
  undefined4 uStack_ba8;
  undefined4 uStack_ba4;
  undefined1 local_ba0 [16];
  undefined4 local_b90;
  undefined4 uStack_b8c;
  undefined4 uStack_b88;
  undefined4 uStack_b84;
  undefined4 local_b80;
  undefined4 uStack_b7c;
  undefined4 uStack_b78;
  undefined4 uStack_b74;
  undefined1 local_b70 [16];
  undefined4 local_b60;
  undefined4 uStack_b5c;
  undefined4 uStack_b58;
  undefined4 uStack_b54;
  undefined1 local_b50 [16];
  uint local_b40;
  uint uStack_b3c;
  uint uStack_b38;
  uint uStack_b34;
  uint uStack_b30;
  uint uStack_b2c;
  uint uStack_b28;
  uint uStack_b24;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar62 = local_7f8;
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar113 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar117 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar122 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar31 = fVar2 * 0.99999964;
  fVar32 = fVar3 * 0.99999964;
  fVar33 = fVar4 * 0.99999964;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  uVar63 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar65 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar61 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_cc8 = uVar63 ^ 0x10;
  iVar5 = (tray->tnear).field_0.i[k];
  auVar92 = ZEXT1664(CONCAT412(iVar5,CONCAT48(iVar5,CONCAT44(iVar5,iVar5))));
  iVar5 = (tray->tfar).field_0.i[k];
  auVar98 = ZEXT1664(CONCAT412(iVar5,CONCAT48(iVar5,CONCAT44(iVar5,iVar5))));
  local_a20._16_16_ = mm_lookupmask_ps._240_16_;
  local_a20._0_16_ = mm_lookupmask_ps._0_16_;
  local_cd0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar81._8_4_ = 0x3f800000;
  auVar81._0_8_ = 0x3f8000003f800000;
  auVar81._12_4_ = 0x3f800000;
  auVar81._16_4_ = 0x3f800000;
  auVar81._20_4_ = 0x3f800000;
  auVar81._24_4_ = 0x3f800000;
  auVar81._28_4_ = 0x3f800000;
  bVar67 = true;
  auVar69._8_4_ = 0xbf800000;
  auVar69._0_8_ = 0xbf800000bf800000;
  auVar69._12_4_ = 0xbf800000;
  auVar69._16_4_ = 0xbf800000;
  auVar69._20_4_ = 0xbf800000;
  auVar69._24_4_ = 0xbf800000;
  auVar69._28_4_ = 0xbf800000;
  auVar69 = vblendvps_avx(auVar81,auVar69,local_a20);
  auVar108 = ZEXT3264(auVar69);
  do {
    uVar64 = puVar62[-1];
    puVar62 = puVar62 + -1;
    auVar87 = auVar92._0_16_;
    auVar93 = auVar98._0_16_;
    auVar109 = auVar113._0_16_;
    auVar114 = auVar117._0_16_;
    auVar119 = auVar122._0_16_;
    while ((uVar64 & 8) == 0) {
      auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar63),auVar109);
      auVar68._0_4_ = fVar31 * auVar34._0_4_;
      auVar68._4_4_ = fVar31 * auVar34._4_4_;
      auVar68._8_4_ = fVar31 * auVar34._8_4_;
      auVar68._12_4_ = fVar31 * auVar34._12_4_;
      auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar65),auVar114);
      auVar72._0_4_ = fVar32 * auVar34._0_4_;
      auVar72._4_4_ = fVar32 * auVar34._4_4_;
      auVar72._8_4_ = fVar32 * auVar34._8_4_;
      auVar72._12_4_ = fVar32 * auVar34._12_4_;
      auVar34 = vmaxps_avx(auVar68,auVar72);
      auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar61),auVar119);
      auVar73._0_4_ = fVar33 * auVar68._0_4_;
      auVar73._4_4_ = fVar33 * auVar68._4_4_;
      auVar73._8_4_ = fVar33 * auVar68._8_4_;
      auVar73._12_4_ = fVar33 * auVar68._12_4_;
      auVar68 = vmaxps_avx(auVar73,auVar87);
      auVar34 = vmaxps_avx(auVar34,auVar68);
      auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + local_cc8),auVar109);
      auVar74._0_4_ = fVar2 * auVar68._0_4_;
      auVar74._4_4_ = fVar2 * auVar68._4_4_;
      auVar74._8_4_ = fVar2 * auVar68._8_4_;
      auVar74._12_4_ = fVar2 * auVar68._12_4_;
      auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + (uVar65 ^ 0x10)),auVar114);
      auVar78._0_4_ = fVar3 * auVar68._0_4_;
      auVar78._4_4_ = fVar3 * auVar68._4_4_;
      auVar78._8_4_ = fVar3 * auVar68._8_4_;
      auVar78._12_4_ = fVar3 * auVar68._12_4_;
      auVar68 = vminps_avx(auVar74,auVar78);
      auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + (uVar61 ^ 0x10)),auVar119);
      auVar79._0_4_ = fVar4 * auVar72._0_4_;
      auVar79._4_4_ = fVar4 * auVar72._4_4_;
      auVar79._8_4_ = fVar4 * auVar72._8_4_;
      auVar79._12_4_ = fVar4 * auVar72._12_4_;
      auVar72 = vminps_avx(auVar79,auVar93);
      auVar68 = vminps_avx(auVar68,auVar72);
      auVar34 = vcmpps_avx(auVar34,auVar68,2);
      uVar58 = vmovmskps_avx(auVar34);
      if (uVar58 == 0) goto LAB_00518037;
      uVar55 = uVar64 & 0xfffffffffffffff0;
      lVar60 = 0;
      for (uVar64 = (ulong)(byte)uVar58; (uVar64 & 1) == 0;
          uVar64 = uVar64 >> 1 | 0x8000000000000000) {
        lVar60 = lVar60 + 1;
      }
      uVar64 = *(ulong *)(uVar55 + lVar60 * 8);
      uVar58 = (uVar58 & 0xff) - 1 & uVar58 & 0xff;
      uVar57 = (ulong)uVar58;
      if (uVar58 != 0) {
        *puVar62 = uVar64;
        lVar60 = 0;
        for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
          lVar60 = lVar60 + 1;
        }
        uVar58 = uVar58 - 1 & uVar58;
        uVar57 = (ulong)uVar58;
        bVar66 = uVar58 == 0;
        while( true ) {
          puVar62 = puVar62 + 1;
          uVar64 = *(ulong *)(uVar55 + lVar60 * 8);
          if (bVar66) break;
          *puVar62 = uVar64;
          lVar60 = 0;
          for (uVar64 = uVar57; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
            lVar60 = lVar60 + 1;
          }
          uVar57 = uVar57 - 1 & uVar57;
          bVar66 = uVar57 == 0;
        }
      }
    }
    uVar55 = (ulong)((uint)uVar64 & 0xf);
    if (uVar55 != 8) {
      uVar64 = uVar64 & 0xfffffffffffffff0;
      local_c20 = 0;
      local_c60 = auVar108._0_32_;
      do {
        lVar56 = local_c20 * 0xe0;
        lVar60 = uVar64 + 0xd0 + lVar56;
        local_a00 = *(undefined8 *)(lVar60 + 0x10);
        uStack_9f8 = *(undefined8 *)(lVar60 + 0x18);
        lVar60 = uVar64 + 0xc0 + lVar56;
        local_9e0 = *(undefined8 *)(lVar60 + 0x10);
        uStack_9d8 = *(undefined8 *)(lVar60 + 0x18);
        uStack_9d0 = local_9e0;
        uStack_9c8 = uStack_9d8;
        uStack_9f0 = local_a00;
        uStack_9e8 = uStack_9f8;
        auVar88._16_16_ = *(undefined1 (*) [16])(uVar64 + 0x60 + lVar56);
        auVar88._0_16_ = *(undefined1 (*) [16])(uVar64 + lVar56);
        auVar76._16_16_ = *(undefined1 (*) [16])(uVar64 + 0x70 + lVar56);
        auVar76._0_16_ = *(undefined1 (*) [16])(uVar64 + 0x10 + lVar56);
        auVar107._16_16_ = *(undefined1 (*) [16])(uVar64 + 0x80 + lVar56);
        auVar107._0_16_ = *(undefined1 (*) [16])(uVar64 + 0x20 + lVar56);
        auVar34 = *(undefined1 (*) [16])(uVar64 + 0x30 + lVar56);
        auVar115._16_16_ = auVar34;
        auVar115._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar64 + 0x40 + lVar56);
        auVar94._16_16_ = auVar34;
        auVar94._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar64 + 0x50 + lVar56);
        auVar99._16_16_ = auVar34;
        auVar99._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar64 + 0x90 + lVar56);
        auVar110._16_16_ = auVar34;
        auVar110._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar64 + 0xa0 + lVar56);
        auVar134._16_16_ = auVar34;
        auVar134._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar64 + 0xb0 + lVar56);
        auVar70._16_16_ = auVar34;
        auVar70._0_16_ = auVar34;
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar130._4_4_ = uVar1;
        auVar130._0_4_ = uVar1;
        auVar130._8_4_ = uVar1;
        auVar130._12_4_ = uVar1;
        auVar130._16_4_ = uVar1;
        auVar130._20_4_ = uVar1;
        auVar130._24_4_ = uVar1;
        auVar130._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar132._4_4_ = uVar1;
        auVar132._0_4_ = uVar1;
        auVar132._8_4_ = uVar1;
        auVar132._12_4_ = uVar1;
        auVar132._16_4_ = uVar1;
        auVar132._20_4_ = uVar1;
        auVar132._24_4_ = uVar1;
        auVar132._28_4_ = uVar1;
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar133._4_4_ = uVar6;
        auVar133._0_4_ = uVar6;
        auVar133._8_4_ = uVar6;
        auVar133._12_4_ = uVar6;
        auVar133._16_4_ = uVar6;
        auVar133._20_4_ = uVar6;
        auVar133._24_4_ = uVar6;
        auVar133._28_4_ = uVar6;
        auVar88 = vsubps_avx(auVar88,auVar130);
        local_cc0 = vsubps_avx(auVar76,auVar132);
        local_be0 = vsubps_avx(auVar107,auVar133);
        auVar69 = vsubps_avx(auVar115,auVar130);
        auVar81 = vsubps_avx(auVar94,auVar132);
        auVar86 = vsubps_avx(auVar99,auVar133);
        auVar76 = vsubps_avx(auVar110,auVar130);
        auVar94 = vsubps_avx(auVar134,auVar132);
        auVar35 = vsubps_avx(auVar70,auVar133);
        auVar70 = vsubps_avx(auVar76,auVar88);
        local_a40 = vsubps_avx(auVar94,local_cc0);
        auVar99 = vsubps_avx(auVar35,local_be0);
        auVar71._0_4_ = auVar88._0_4_ + auVar76._0_4_;
        auVar71._4_4_ = auVar88._4_4_ + auVar76._4_4_;
        auVar71._8_4_ = auVar88._8_4_ + auVar76._8_4_;
        auVar71._12_4_ = auVar88._12_4_ + auVar76._12_4_;
        auVar71._16_4_ = auVar88._16_4_ + auVar76._16_4_;
        auVar71._20_4_ = auVar88._20_4_ + auVar76._20_4_;
        auVar71._24_4_ = auVar88._24_4_ + auVar76._24_4_;
        auVar71._28_4_ = auVar88._28_4_ + auVar76._28_4_;
        auVar111._0_4_ = auVar94._0_4_ + local_cc0._0_4_;
        auVar111._4_4_ = auVar94._4_4_ + local_cc0._4_4_;
        auVar111._8_4_ = auVar94._8_4_ + local_cc0._8_4_;
        auVar111._12_4_ = auVar94._12_4_ + local_cc0._12_4_;
        auVar111._16_4_ = auVar94._16_4_ + local_cc0._16_4_;
        auVar111._20_4_ = auVar94._20_4_ + local_cc0._20_4_;
        auVar111._24_4_ = auVar94._24_4_ + local_cc0._24_4_;
        auVar111._28_4_ = auVar94._28_4_ + local_cc0._28_4_;
        fVar9 = local_be0._0_4_;
        auVar95._0_4_ = auVar35._0_4_ + fVar9;
        fVar10 = local_be0._4_4_;
        auVar95._4_4_ = auVar35._4_4_ + fVar10;
        fVar11 = local_be0._8_4_;
        auVar95._8_4_ = auVar35._8_4_ + fVar11;
        fVar12 = local_be0._12_4_;
        auVar95._12_4_ = auVar35._12_4_ + fVar12;
        fVar13 = local_be0._16_4_;
        auVar95._16_4_ = auVar35._16_4_ + fVar13;
        fVar14 = local_be0._20_4_;
        auVar95._20_4_ = auVar35._20_4_ + fVar14;
        fVar15 = local_be0._24_4_;
        auVar95._24_4_ = auVar35._24_4_ + fVar15;
        fVar123 = auVar35._28_4_;
        auVar95._28_4_ = fVar123 + local_be0._28_4_;
        auVar36._4_4_ = auVar99._4_4_ * auVar111._4_4_;
        auVar36._0_4_ = auVar99._0_4_ * auVar111._0_4_;
        auVar36._8_4_ = auVar99._8_4_ * auVar111._8_4_;
        auVar36._12_4_ = auVar99._12_4_ * auVar111._12_4_;
        auVar36._16_4_ = auVar99._16_4_ * auVar111._16_4_;
        auVar36._20_4_ = auVar99._20_4_ * auVar111._20_4_;
        auVar36._24_4_ = auVar99._24_4_ * auVar111._24_4_;
        auVar36._28_4_ = uVar1;
        auVar68 = vfmsub231ps_fma(auVar36,local_a40,auVar95);
        auVar39._4_4_ = auVar70._4_4_ * auVar95._4_4_;
        auVar39._0_4_ = auVar70._0_4_ * auVar95._0_4_;
        auVar39._8_4_ = auVar70._8_4_ * auVar95._8_4_;
        auVar39._12_4_ = auVar70._12_4_ * auVar95._12_4_;
        auVar39._16_4_ = auVar70._16_4_ * auVar95._16_4_;
        auVar39._20_4_ = auVar70._20_4_ * auVar95._20_4_;
        auVar39._24_4_ = auVar70._24_4_ * auVar95._24_4_;
        auVar39._28_4_ = auVar95._28_4_;
        auVar34 = vfmsub231ps_fma(auVar39,auVar99,auVar71);
        auVar40._4_4_ = local_a40._4_4_ * auVar71._4_4_;
        auVar40._0_4_ = local_a40._0_4_ * auVar71._0_4_;
        auVar40._8_4_ = local_a40._8_4_ * auVar71._8_4_;
        auVar40._12_4_ = local_a40._12_4_ * auVar71._12_4_;
        auVar40._16_4_ = local_a40._16_4_ * auVar71._16_4_;
        auVar40._20_4_ = local_a40._20_4_ * auVar71._20_4_;
        auVar40._24_4_ = local_a40._24_4_ * auVar71._24_4_;
        auVar40._28_4_ = auVar71._28_4_;
        auVar72 = vfmsub231ps_fma(auVar40,auVar70,auVar111);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar131._4_4_ = uVar1;
        auVar131._0_4_ = uVar1;
        auVar131._8_4_ = uVar1;
        auVar131._12_4_ = uVar1;
        auVar131._16_4_ = uVar1;
        auVar131._20_4_ = uVar1;
        auVar131._24_4_ = uVar1;
        auVar131._28_4_ = uVar1;
        local_a80 = *(float *)(ray + k * 4 + 0x60);
        auVar41._4_4_ = local_a80 * auVar72._4_4_;
        auVar41._0_4_ = local_a80 * auVar72._0_4_;
        auVar41._8_4_ = local_a80 * auVar72._8_4_;
        auVar41._12_4_ = local_a80 * auVar72._12_4_;
        auVar41._16_4_ = local_a80 * 0.0;
        auVar41._20_4_ = local_a80 * 0.0;
        auVar41._24_4_ = local_a80 * 0.0;
        auVar41._28_4_ = fVar123;
        auVar34 = vfmadd231ps_fma(auVar41,auVar131,ZEXT1632(auVar34));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        local_a60._4_4_ = uVar1;
        local_a60._0_4_ = uVar1;
        local_a60._8_4_ = uVar1;
        local_a60._12_4_ = uVar1;
        local_a60._16_4_ = uVar1;
        local_a60._20_4_ = uVar1;
        local_a60._24_4_ = uVar1;
        local_a60._28_4_ = uVar1;
        auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),local_a60,ZEXT1632(auVar68));
        local_aa0 = vsubps_avx(local_cc0,auVar81);
        local_ac0 = vsubps_avx(local_be0,auVar86);
        auVar82._0_4_ = auVar81._0_4_ + local_cc0._0_4_;
        auVar82._4_4_ = auVar81._4_4_ + local_cc0._4_4_;
        auVar82._8_4_ = auVar81._8_4_ + local_cc0._8_4_;
        auVar82._12_4_ = auVar81._12_4_ + local_cc0._12_4_;
        auVar82._16_4_ = auVar81._16_4_ + local_cc0._16_4_;
        auVar82._20_4_ = auVar81._20_4_ + local_cc0._20_4_;
        auVar82._24_4_ = auVar81._24_4_ + local_cc0._24_4_;
        auVar82._28_4_ = auVar81._28_4_ + local_cc0._28_4_;
        auVar96._0_4_ = fVar9 + auVar86._0_4_;
        auVar96._4_4_ = fVar10 + auVar86._4_4_;
        auVar96._8_4_ = fVar11 + auVar86._8_4_;
        auVar96._12_4_ = fVar12 + auVar86._12_4_;
        auVar96._16_4_ = fVar13 + auVar86._16_4_;
        auVar96._20_4_ = fVar14 + auVar86._20_4_;
        auVar96._24_4_ = fVar15 + auVar86._24_4_;
        fVar118 = auVar86._28_4_;
        auVar96._28_4_ = local_be0._28_4_ + fVar118;
        fVar101 = local_ac0._0_4_;
        fVar104 = local_ac0._4_4_;
        auVar42._4_4_ = auVar82._4_4_ * fVar104;
        auVar42._0_4_ = auVar82._0_4_ * fVar101;
        fVar16 = local_ac0._8_4_;
        auVar42._8_4_ = auVar82._8_4_ * fVar16;
        fVar19 = local_ac0._12_4_;
        auVar42._12_4_ = auVar82._12_4_ * fVar19;
        fVar22 = local_ac0._16_4_;
        auVar42._16_4_ = auVar82._16_4_ * fVar22;
        fVar25 = local_ac0._20_4_;
        auVar42._20_4_ = auVar82._20_4_ * fVar25;
        fVar28 = local_ac0._24_4_;
        auVar42._24_4_ = auVar82._24_4_ * fVar28;
        auVar42._28_4_ = auVar111._28_4_;
        auVar72 = vfmsub231ps_fma(auVar42,local_aa0,auVar96);
        local_ae0 = vsubps_avx(auVar88,auVar69);
        fVar102 = local_ae0._0_4_;
        fVar105 = local_ae0._4_4_;
        auVar43._4_4_ = auVar96._4_4_ * fVar105;
        auVar43._0_4_ = auVar96._0_4_ * fVar102;
        fVar17 = local_ae0._8_4_;
        auVar43._8_4_ = auVar96._8_4_ * fVar17;
        fVar20 = local_ae0._12_4_;
        auVar43._12_4_ = auVar96._12_4_ * fVar20;
        fVar23 = local_ae0._16_4_;
        auVar43._16_4_ = auVar96._16_4_ * fVar23;
        fVar26 = local_ae0._20_4_;
        auVar43._20_4_ = auVar96._20_4_ * fVar26;
        fVar29 = local_ae0._24_4_;
        auVar43._24_4_ = auVar96._24_4_ * fVar29;
        auVar43._28_4_ = auVar96._28_4_;
        auVar120._0_4_ = auVar88._0_4_ + auVar69._0_4_;
        auVar120._4_4_ = auVar88._4_4_ + auVar69._4_4_;
        auVar120._8_4_ = auVar88._8_4_ + auVar69._8_4_;
        auVar120._12_4_ = auVar88._12_4_ + auVar69._12_4_;
        auVar120._16_4_ = auVar88._16_4_ + auVar69._16_4_;
        auVar120._20_4_ = auVar88._20_4_ + auVar69._20_4_;
        auVar120._24_4_ = auVar88._24_4_ + auVar69._24_4_;
        auVar120._28_4_ = auVar88._28_4_ + auVar69._28_4_;
        auVar68 = vfmsub231ps_fma(auVar43,local_ac0,auVar120);
        fVar103 = local_aa0._0_4_;
        fVar106 = local_aa0._4_4_;
        auVar44._4_4_ = auVar120._4_4_ * fVar106;
        auVar44._0_4_ = auVar120._0_4_ * fVar103;
        fVar18 = local_aa0._8_4_;
        auVar44._8_4_ = auVar120._8_4_ * fVar18;
        fVar21 = local_aa0._12_4_;
        auVar44._12_4_ = auVar120._12_4_ * fVar21;
        fVar24 = local_aa0._16_4_;
        auVar44._16_4_ = auVar120._16_4_ * fVar24;
        fVar27 = local_aa0._20_4_;
        auVar44._20_4_ = auVar120._20_4_ * fVar27;
        fVar30 = local_aa0._24_4_;
        auVar44._24_4_ = auVar120._24_4_ * fVar30;
        auVar44._28_4_ = auVar120._28_4_;
        auVar73 = vfmsub231ps_fma(auVar44,local_ae0,auVar82);
        auVar121._0_4_ = auVar73._0_4_ * local_a80;
        auVar121._4_4_ = auVar73._4_4_ * local_a80;
        auVar121._8_4_ = auVar73._8_4_ * local_a80;
        auVar121._12_4_ = auVar73._12_4_ * local_a80;
        auVar121._16_4_ = local_a80 * 0.0;
        auVar121._20_4_ = local_a80 * 0.0;
        auVar121._24_4_ = local_a80 * 0.0;
        auVar121._28_4_ = 0;
        auVar68 = vfmadd231ps_fma(auVar121,auVar131,ZEXT1632(auVar68));
        auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),local_a60,ZEXT1632(auVar72));
        auVar36 = vsubps_avx(auVar69,auVar76);
        auVar89._0_4_ = auVar69._0_4_ + auVar76._0_4_;
        auVar89._4_4_ = auVar69._4_4_ + auVar76._4_4_;
        auVar89._8_4_ = auVar69._8_4_ + auVar76._8_4_;
        auVar89._12_4_ = auVar69._12_4_ + auVar76._12_4_;
        auVar89._16_4_ = auVar69._16_4_ + auVar76._16_4_;
        auVar89._20_4_ = auVar69._20_4_ + auVar76._20_4_;
        auVar89._24_4_ = auVar69._24_4_ + auVar76._24_4_;
        auVar89._28_4_ = auVar69._28_4_ + auVar76._28_4_;
        auVar76 = vsubps_avx(auVar81,auVar94);
        auVar100._0_4_ = auVar81._0_4_ + auVar94._0_4_;
        auVar100._4_4_ = auVar81._4_4_ + auVar94._4_4_;
        auVar100._8_4_ = auVar81._8_4_ + auVar94._8_4_;
        auVar100._12_4_ = auVar81._12_4_ + auVar94._12_4_;
        auVar100._16_4_ = auVar81._16_4_ + auVar94._16_4_;
        auVar100._20_4_ = auVar81._20_4_ + auVar94._20_4_;
        auVar100._24_4_ = auVar81._24_4_ + auVar94._24_4_;
        auVar100._28_4_ = auVar81._28_4_ + auVar94._28_4_;
        auVar94 = vsubps_avx(auVar86,auVar35);
        auVar83._0_4_ = auVar86._0_4_ + auVar35._0_4_;
        auVar83._4_4_ = auVar86._4_4_ + auVar35._4_4_;
        auVar83._8_4_ = auVar86._8_4_ + auVar35._8_4_;
        auVar83._12_4_ = auVar86._12_4_ + auVar35._12_4_;
        auVar83._16_4_ = auVar86._16_4_ + auVar35._16_4_;
        auVar83._20_4_ = auVar86._20_4_ + auVar35._20_4_;
        auVar83._24_4_ = auVar86._24_4_ + auVar35._24_4_;
        auVar83._28_4_ = fVar118 + fVar123;
        auVar86._4_4_ = auVar94._4_4_ * auVar100._4_4_;
        auVar86._0_4_ = auVar94._0_4_ * auVar100._0_4_;
        auVar86._8_4_ = auVar94._8_4_ * auVar100._8_4_;
        auVar86._12_4_ = auVar94._12_4_ * auVar100._12_4_;
        auVar86._16_4_ = auVar94._16_4_ * auVar100._16_4_;
        auVar86._20_4_ = auVar94._20_4_ * auVar100._20_4_;
        auVar86._24_4_ = auVar94._24_4_ * auVar100._24_4_;
        auVar86._28_4_ = fVar118;
        auVar73 = vfmsub231ps_fma(auVar86,auVar76,auVar83);
        auVar35._4_4_ = auVar83._4_4_ * auVar36._4_4_;
        auVar35._0_4_ = auVar83._0_4_ * auVar36._0_4_;
        auVar35._8_4_ = auVar83._8_4_ * auVar36._8_4_;
        auVar35._12_4_ = auVar83._12_4_ * auVar36._12_4_;
        auVar35._16_4_ = auVar83._16_4_ * auVar36._16_4_;
        auVar35._20_4_ = auVar83._20_4_ * auVar36._20_4_;
        auVar35._24_4_ = auVar83._24_4_ * auVar36._24_4_;
        auVar35._28_4_ = auVar83._28_4_;
        auVar72 = vfmsub231ps_fma(auVar35,auVar94,auVar89);
        auVar45._4_4_ = auVar76._4_4_ * auVar89._4_4_;
        auVar45._0_4_ = auVar76._0_4_ * auVar89._0_4_;
        auVar45._8_4_ = auVar76._8_4_ * auVar89._8_4_;
        auVar45._12_4_ = auVar76._12_4_ * auVar89._12_4_;
        auVar45._16_4_ = auVar76._16_4_ * auVar89._16_4_;
        auVar45._20_4_ = auVar76._20_4_ * auVar89._20_4_;
        auVar45._24_4_ = auVar76._24_4_ * auVar89._24_4_;
        auVar45._28_4_ = auVar89._28_4_;
        auVar74 = vfmsub231ps_fma(auVar45,auVar36,auVar100);
        auVar90._0_4_ = local_a80 * auVar74._0_4_;
        auVar90._4_4_ = local_a80 * auVar74._4_4_;
        auVar90._8_4_ = local_a80 * auVar74._8_4_;
        auVar90._12_4_ = local_a80 * auVar74._12_4_;
        auVar90._16_4_ = local_a80 * 0.0;
        auVar90._20_4_ = local_a80 * 0.0;
        auVar90._24_4_ = local_a80 * 0.0;
        auVar90._28_4_ = 0;
        auVar72 = vfmadd231ps_fma(auVar90,auVar131,ZEXT1632(auVar72));
        auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),local_a60,ZEXT1632(auVar73));
        local_9a0 = ZEXT1632(auVar68);
        local_9c0 = auVar34._0_4_;
        fStack_9bc = auVar34._4_4_;
        fStack_9b8 = auVar34._8_4_;
        fStack_9b4 = auVar34._12_4_;
        local_980 = ZEXT1632(CONCAT412(auVar72._12_4_ + auVar68._12_4_ + fStack_9b4,
                                       CONCAT48(auVar72._8_4_ + auVar68._8_4_ + fStack_9b8,
                                                CONCAT44(auVar72._4_4_ + auVar68._4_4_ + fStack_9bc,
                                                         auVar72._0_4_ + auVar68._0_4_ + local_9c0))
                                      ));
        auVar84._8_4_ = 0x7fffffff;
        auVar84._0_8_ = 0x7fffffff7fffffff;
        auVar84._12_4_ = 0x7fffffff;
        auVar84._16_4_ = 0x7fffffff;
        auVar84._20_4_ = 0x7fffffff;
        auVar84._24_4_ = 0x7fffffff;
        auVar84._28_4_ = 0x7fffffff;
        auVar69 = vminps_avx(ZEXT1632(auVar34),local_9a0);
        auVar69 = vminps_avx(auVar69,ZEXT1632(auVar72));
        local_b20 = vandps_avx(local_980,auVar84);
        fVar118 = local_b20._0_4_ * 1.1920929e-07;
        fVar123 = local_b20._4_4_ * 1.1920929e-07;
        auVar46._4_4_ = fVar123;
        auVar46._0_4_ = fVar118;
        fVar124 = local_b20._8_4_ * 1.1920929e-07;
        auVar46._8_4_ = fVar124;
        fVar125 = local_b20._12_4_ * 1.1920929e-07;
        auVar46._12_4_ = fVar125;
        fVar126 = local_b20._16_4_ * 1.1920929e-07;
        auVar46._16_4_ = fVar126;
        fVar127 = local_b20._20_4_ * 1.1920929e-07;
        auVar46._20_4_ = fVar127;
        fVar128 = local_b20._24_4_ * 1.1920929e-07;
        auVar46._24_4_ = fVar128;
        auVar46._28_4_ = 0x34000000;
        auVar112._0_8_ = CONCAT44(fVar123,fVar118) ^ 0x8000000080000000;
        auVar112._8_4_ = -fVar124;
        auVar112._12_4_ = -fVar125;
        auVar112._16_4_ = -fVar126;
        auVar112._20_4_ = -fVar127;
        auVar112._24_4_ = -fVar128;
        auVar112._28_4_ = 0xb4000000;
        auVar69 = vcmpps_avx(auVar69,auVar112,5);
        local_b00 = ZEXT1632(auVar34);
        auVar86 = vmaxps_avx(local_b00,local_9a0);
        auVar81 = vmaxps_avx(auVar86,ZEXT1632(auVar72));
        auVar81 = vcmpps_avx(auVar81,auVar46,2);
        auVar81 = vorps_avx(auVar69,auVar81);
        if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar81 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar81 >> 0x7f,0) == '\0') &&
              (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar81 >> 0xbf,0) == '\0') &&
            (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar81[0x1f]) {
LAB_00517fc2:
          auVar108 = ZEXT3264(local_c60);
        }
        else {
          auVar47._4_4_ = fVar106 * auVar99._4_4_;
          auVar47._0_4_ = fVar103 * auVar99._0_4_;
          auVar47._8_4_ = fVar18 * auVar99._8_4_;
          auVar47._12_4_ = fVar21 * auVar99._12_4_;
          auVar47._16_4_ = fVar24 * auVar99._16_4_;
          auVar47._20_4_ = fVar27 * auVar99._20_4_;
          auVar47._24_4_ = fVar30 * auVar99._24_4_;
          auVar47._28_4_ = auVar69._28_4_;
          auVar48._4_4_ = fVar105 * local_a40._4_4_;
          auVar48._0_4_ = fVar102 * local_a40._0_4_;
          auVar48._8_4_ = fVar17 * local_a40._8_4_;
          auVar48._12_4_ = fVar20 * local_a40._12_4_;
          auVar48._16_4_ = fVar23 * local_a40._16_4_;
          auVar48._20_4_ = fVar26 * local_a40._20_4_;
          auVar48._24_4_ = fVar29 * local_a40._24_4_;
          auVar48._28_4_ = 0x34000000;
          auVar34 = vfmsub213ps_fma(local_a40,local_ac0,auVar47);
          auVar49._4_4_ = auVar76._4_4_ * fVar104;
          auVar49._0_4_ = auVar76._0_4_ * fVar101;
          auVar49._8_4_ = auVar76._8_4_ * fVar16;
          auVar49._12_4_ = auVar76._12_4_ * fVar19;
          auVar49._16_4_ = auVar76._16_4_ * fVar22;
          auVar49._20_4_ = auVar76._20_4_ * fVar25;
          auVar49._24_4_ = auVar76._24_4_ * fVar28;
          auVar49._28_4_ = auVar86._28_4_;
          auVar50._4_4_ = fVar105 * auVar94._4_4_;
          auVar50._0_4_ = fVar102 * auVar94._0_4_;
          auVar50._8_4_ = fVar17 * auVar94._8_4_;
          auVar50._12_4_ = fVar20 * auVar94._12_4_;
          auVar50._16_4_ = fVar23 * auVar94._16_4_;
          auVar50._20_4_ = fVar26 * auVar94._20_4_;
          auVar50._24_4_ = fVar29 * auVar94._24_4_;
          auVar50._28_4_ = local_b20._28_4_;
          auVar72 = vfmsub213ps_fma(auVar94,local_aa0,auVar49);
          auVar69 = vandps_avx(auVar47,auVar84);
          auVar86 = vandps_avx(auVar49,auVar84);
          auVar69 = vcmpps_avx(auVar69,auVar86,1);
          local_960 = vblendvps_avx(ZEXT1632(auVar72),ZEXT1632(auVar34),auVar69);
          auVar51._4_4_ = fVar106 * auVar36._4_4_;
          auVar51._0_4_ = fVar103 * auVar36._0_4_;
          auVar51._8_4_ = fVar18 * auVar36._8_4_;
          auVar51._12_4_ = fVar21 * auVar36._12_4_;
          auVar51._16_4_ = fVar24 * auVar36._16_4_;
          auVar51._20_4_ = fVar27 * auVar36._20_4_;
          auVar51._24_4_ = fVar30 * auVar36._24_4_;
          auVar51._28_4_ = auVar69._28_4_;
          auVar34 = vfmsub213ps_fma(auVar36,local_ac0,auVar50);
          auVar52._4_4_ = auVar70._4_4_ * fVar104;
          auVar52._0_4_ = auVar70._0_4_ * fVar101;
          auVar52._8_4_ = auVar70._8_4_ * fVar16;
          auVar52._12_4_ = auVar70._12_4_ * fVar19;
          auVar52._16_4_ = auVar70._16_4_ * fVar22;
          auVar52._20_4_ = auVar70._20_4_ * fVar25;
          auVar52._24_4_ = auVar70._24_4_ * fVar28;
          auVar52._28_4_ = auVar86._28_4_;
          auVar72 = vfmsub213ps_fma(auVar99,local_ae0,auVar52);
          auVar69 = vandps_avx(auVar52,auVar84);
          auVar86 = vandps_avx(auVar50,auVar84);
          auVar69 = vcmpps_avx(auVar69,auVar86,1);
          local_940 = vblendvps_avx(ZEXT1632(auVar34),ZEXT1632(auVar72),auVar69);
          auVar34 = vfmsub213ps_fma(auVar70,local_aa0,auVar48);
          auVar72 = vfmsub213ps_fma(auVar76,local_ae0,auVar51);
          auVar69 = vandps_avx(auVar48,auVar84);
          auVar86 = vandps_avx(auVar51,auVar84);
          auVar69 = vcmpps_avx(auVar69,auVar86,1);
          local_920 = vblendvps_avx(ZEXT1632(auVar72),ZEXT1632(auVar34),auVar69);
          auVar34 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
          fVar118 = local_920._0_4_;
          auVar85._0_4_ = fVar118 * local_a80;
          fVar101 = local_920._4_4_;
          auVar85._4_4_ = fVar101 * local_a80;
          fVar102 = local_920._8_4_;
          auVar85._8_4_ = fVar102 * local_a80;
          fVar103 = local_920._12_4_;
          auVar85._12_4_ = fVar103 * local_a80;
          fVar104 = local_920._16_4_;
          auVar85._16_4_ = fVar104 * local_a80;
          fVar105 = local_920._20_4_;
          auVar85._20_4_ = fVar105 * local_a80;
          fVar106 = local_920._24_4_;
          auVar85._24_4_ = fVar106 * local_a80;
          auVar85._28_4_ = 0;
          auVar72 = vfmadd213ps_fma(auVar131,local_940,auVar85);
          auVar72 = vfmadd213ps_fma(local_a60,local_960,ZEXT1632(auVar72));
          auVar86 = ZEXT1632(CONCAT412(auVar72._12_4_ + auVar72._12_4_,
                                       CONCAT48(auVar72._8_4_ + auVar72._8_4_,
                                                CONCAT44(auVar72._4_4_ + auVar72._4_4_,
                                                         auVar72._0_4_ + auVar72._0_4_))));
          auVar53._4_4_ = fVar101 * fVar10;
          auVar53._0_4_ = fVar118 * fVar9;
          auVar53._8_4_ = fVar102 * fVar11;
          auVar53._12_4_ = fVar103 * fVar12;
          auVar53._16_4_ = fVar104 * fVar13;
          auVar53._20_4_ = fVar105 * fVar14;
          auVar53._24_4_ = fVar106 * fVar15;
          auVar53._28_4_ = auVar81._28_4_;
          auVar72 = vfmadd213ps_fma(local_cc0,local_940,auVar53);
          auVar73 = vfmadd213ps_fma(auVar88,local_960,ZEXT1632(auVar72));
          auVar69 = vrcpps_avx(auVar86);
          auVar129._8_4_ = 0x3f800000;
          auVar129._0_8_ = 0x3f8000003f800000;
          auVar129._12_4_ = 0x3f800000;
          auVar129._16_4_ = 0x3f800000;
          auVar129._20_4_ = 0x3f800000;
          auVar129._24_4_ = 0x3f800000;
          auVar129._28_4_ = 0x3f800000;
          auVar72 = vfnmadd213ps_fma(auVar69,auVar86,auVar129);
          auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar69,auVar69);
          local_8a0 = ZEXT1632(CONCAT412(auVar72._12_4_ * (auVar73._12_4_ + auVar73._12_4_),
                                         CONCAT48(auVar72._8_4_ * (auVar73._8_4_ + auVar73._8_4_),
                                                  CONCAT44(auVar72._4_4_ *
                                                           (auVar73._4_4_ + auVar73._4_4_),
                                                           auVar72._0_4_ *
                                                           (auVar73._0_4_ + auVar73._0_4_)))));
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar116._4_4_ = uVar1;
          auVar116._0_4_ = uVar1;
          auVar116._8_4_ = uVar1;
          auVar116._12_4_ = uVar1;
          auVar116._16_4_ = uVar1;
          auVar116._20_4_ = uVar1;
          auVar116._24_4_ = uVar1;
          auVar116._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          local_c00._4_4_ = uVar1;
          local_c00._0_4_ = uVar1;
          local_c00._8_4_ = uVar1;
          local_c00._12_4_ = uVar1;
          local_c00._16_4_ = uVar1;
          local_c00._20_4_ = uVar1;
          local_c00._24_4_ = uVar1;
          local_c00._28_4_ = uVar1;
          auVar69 = vcmpps_avx(auVar116,local_8a0,2);
          auVar81 = vcmpps_avx(local_8a0,local_c00,2);
          auVar69 = vandps_avx(auVar69,auVar81);
          auVar72 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
          auVar34 = vpand_avx(auVar72,auVar34);
          auVar69 = vpmovsxwd_avx2(auVar34);
          if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar69 >> 0x7f,0) == '\0') &&
                (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar69 >> 0xbf,0) == '\0') &&
              (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar69[0x1f]) goto LAB_00517fc2;
          auVar69 = vcmpps_avx(auVar86,_DAT_01faff00,4);
          auVar72 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
          auVar34 = vpand_avx(auVar34,auVar72);
          local_900 = vpmovsxwd_avx2(auVar34);
          if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_900 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_900 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_900 >> 0x7f,0) == '\0') &&
                (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_900 >> 0xbf,0) == '\0') &&
              (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_900[0x1f]) goto LAB_00517fc2;
          auStack_c18 = auVar99._8_24_;
          uStack_9b0 = 0;
          uStack_9ac = 0;
          uStack_9a8 = 0;
          uStack_9a4 = 0;
          local_820 = local_a20;
          auVar69 = vrcpps_avx(local_980);
          auVar97._8_4_ = 0x3f800000;
          auVar97._0_8_ = 0x3f8000003f800000;
          auVar97._12_4_ = 0x3f800000;
          auVar97._16_4_ = 0x3f800000;
          auVar97._20_4_ = 0x3f800000;
          auVar97._24_4_ = 0x3f800000;
          auVar97._28_4_ = 0x3f800000;
          auVar72 = vfnmadd213ps_fma(local_980,auVar69,auVar97);
          auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar69,auVar69);
          auVar91._8_4_ = 0x219392ef;
          auVar91._0_8_ = 0x219392ef219392ef;
          auVar91._12_4_ = 0x219392ef;
          auVar91._16_4_ = 0x219392ef;
          auVar91._20_4_ = 0x219392ef;
          auVar91._24_4_ = 0x219392ef;
          auVar91._28_4_ = 0x219392ef;
          auVar69 = vcmpps_avx(local_b20,auVar91,5);
          auVar69 = vandps_avx(auVar69,ZEXT1632(auVar72));
          auVar54._4_4_ = fStack_9bc * auVar69._4_4_;
          auVar54._0_4_ = local_9c0 * auVar69._0_4_;
          auVar54._8_4_ = fStack_9b8 * auVar69._8_4_;
          auVar54._12_4_ = fStack_9b4 * auVar69._12_4_;
          auVar54._16_4_ = auVar69._16_4_ * 0.0;
          auVar54._20_4_ = auVar69._20_4_ * 0.0;
          auVar54._24_4_ = auVar69._24_4_ * 0.0;
          auVar54._28_4_ = 0;
          auVar81 = vminps_avx(auVar54,auVar97);
          auVar77._0_4_ = auVar68._0_4_ * auVar69._0_4_;
          auVar77._4_4_ = auVar68._4_4_ * auVar69._4_4_;
          auVar77._8_4_ = auVar68._8_4_ * auVar69._8_4_;
          auVar77._12_4_ = auVar68._12_4_ * auVar69._12_4_;
          auVar77._16_4_ = auVar69._16_4_ * 0.0;
          auVar77._20_4_ = auVar69._20_4_ * 0.0;
          auVar77._24_4_ = auVar69._24_4_ * 0.0;
          auVar77._28_4_ = 0;
          auVar69 = vminps_avx(auVar77,auVar97);
          auVar86 = vsubps_avx(auVar97,auVar81);
          auVar76 = vsubps_avx(auVar97,auVar69);
          local_8c0 = vblendvps_avx(auVar69,auVar86,local_a20);
          local_8e0 = vblendvps_avx(auVar81,auVar76,local_a20);
          auVar108 = ZEXT3264(local_c60);
          fVar9 = local_c60._0_4_;
          fVar10 = local_c60._4_4_;
          fVar11 = local_c60._8_4_;
          fVar12 = local_c60._12_4_;
          fVar13 = local_c60._16_4_;
          fVar14 = local_c60._20_4_;
          fVar15 = local_c60._24_4_;
          local_860._4_4_ = fVar10 * local_940._4_4_;
          local_860._0_4_ = fVar9 * local_940._0_4_;
          local_860._8_4_ = fVar11 * local_940._8_4_;
          local_860._12_4_ = fVar12 * local_940._12_4_;
          local_860._16_4_ = fVar13 * local_940._16_4_;
          local_860._20_4_ = fVar14 * local_940._20_4_;
          local_860._24_4_ = fVar15 * local_940._24_4_;
          local_860._28_4_ = local_8c0._28_4_;
          local_880[0] = local_960._0_4_ * fVar9;
          local_880[1] = local_960._4_4_ * fVar10;
          local_880[2] = local_960._8_4_ * fVar11;
          local_880[3] = local_960._12_4_ * fVar12;
          fStack_870 = local_960._16_4_ * fVar13;
          fStack_86c = local_960._20_4_ * fVar14;
          fStack_868 = local_960._24_4_ * fVar15;
          uStack_864 = local_8e0._28_4_;
          local_840[0] = fVar9 * fVar118;
          local_840[1] = fVar10 * fVar101;
          local_840[2] = fVar11 * fVar102;
          local_840[3] = fVar12 * fVar103;
          fStack_830 = fVar13 * fVar104;
          fStack_82c = fVar14 * fVar105;
          fStack_828 = fVar15 * fVar106;
          uStack_824 = auVar86._28_4_;
          auVar34 = vpacksswb_avx(auVar34,auVar34);
          uVar57 = (ulong)(byte)(SUB161(auVar34 >> 7,0) & 1 | (SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar34 >> 0x3f,0) << 7);
          auStack_c38 = auVar88._8_24_;
          local_c40 = context->scene;
          pSVar59 = context->scene;
          fStack_a7c = local_a80;
          fStack_a78 = local_a80;
          fStack_a74 = local_a80;
          fStack_a70 = local_a80;
          fStack_a6c = local_a80;
          fStack_a68 = local_a80;
          fStack_a64 = local_a80;
          do {
            uVar37 = 0;
            for (uVar38 = uVar57; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
              uVar37 = uVar37 + 1;
            }
            uVar58 = *(uint *)((long)&local_9e0 + uVar37 * 4);
            pGVar7 = (pSVar59->geometries).items[uVar58].ptr;
            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              uVar57 = uVar57 ^ 1L << (uVar37 & 0x3f);
            }
            else {
              local_cc0._0_8_ = uVar37;
              local_be0._0_8_ = uVar57;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0051804d:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar67;
              }
              uVar57 = (ulong)(uint)((int)uVar37 * 4);
              local_b80 = *(undefined4 *)(local_8e0 + uVar57);
              uVar1 = *(undefined4 *)(local_8c0 + uVar57);
              local_b70._4_4_ = uVar1;
              local_b70._0_4_ = uVar1;
              local_b70._8_4_ = uVar1;
              local_b70._12_4_ = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a0 + uVar57);
              local_c90.context = context->user;
              local_b50._4_4_ = uVar58;
              local_b50._0_4_ = uVar58;
              local_b50._8_4_ = uVar58;
              local_b50._12_4_ = uVar58;
              local_b60 = *(undefined4 *)((long)&local_a00 + uVar57);
              local_bb0 = *(undefined4 *)((long)local_880 + uVar57);
              uVar1 = *(undefined4 *)(local_860 + uVar57);
              local_ba0._4_4_ = uVar1;
              local_ba0._0_4_ = uVar1;
              local_ba0._8_4_ = uVar1;
              local_ba0._12_4_ = uVar1;
              local_b90 = *(undefined4 *)((long)local_840 + uVar57);
              vpcmpeqd_avx2(ZEXT1632(local_b50),ZEXT1632(local_b50));
              uStack_b3c = (local_c90.context)->instID[0];
              local_b40 = uStack_b3c;
              uStack_b38 = uStack_b3c;
              uStack_b34 = uStack_b3c;
              uStack_b30 = (local_c90.context)->instPrimID[0];
              uStack_b2c = uStack_b30;
              uStack_b28 = uStack_b30;
              uStack_b24 = uStack_b30;
              local_ce0 = *local_cd0;
              local_c90.valid = (int *)local_ce0;
              local_c90.geometryUserPtr = pGVar7->userPtr;
              local_c90.hit = (RTCHitN *)&local_bb0;
              local_c90.N = 4;
              local_c90.ray = (RTCRayN *)ray;
              uStack_bac = local_bb0;
              uStack_ba8 = local_bb0;
              uStack_ba4 = local_bb0;
              uStack_b8c = local_b90;
              uStack_b88 = local_b90;
              uStack_b84 = local_b90;
              uStack_b7c = local_b80;
              uStack_b78 = local_b80;
              uStack_b74 = local_b80;
              uStack_b5c = local_b60;
              uStack_b58 = local_b60;
              uStack_b54 = local_b60;
              if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar7->occlusionFilterN)(&local_c90);
              }
              if (local_ce0 == (undefined1  [16])0x0) {
                auVar34 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                auVar34 = auVar34 ^ _DAT_01f7ae20;
              }
              else {
                p_Var8 = context->args->filter;
                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var8)(&local_c90);
                }
                auVar68 = vpcmpeqd_avx(local_ce0,_DAT_01f7aa10);
                auVar34 = auVar68 ^ _DAT_01f7ae20;
                auVar80._8_4_ = 0xff800000;
                auVar80._0_8_ = 0xff800000ff800000;
                auVar80._12_4_ = 0xff800000;
                auVar68 = vblendvps_avx(auVar80,*(undefined1 (*) [16])(local_c90.ray + 0x80),auVar68
                                       );
                *(undefined1 (*) [16])(local_c90.ray + 0x80) = auVar68;
              }
              auVar108 = ZEXT3264(local_c60);
              auVar75._8_8_ = 0x100000001;
              auVar75._0_8_ = 0x100000001;
              if ((auVar75 & auVar34) != (undefined1  [16])0x0) goto LAB_0051804d;
              *(int *)(ray + k * 4 + 0x80) = local_c00._0_4_;
              uVar57 = local_be0._0_8_ ^ 1L << (local_cc0._0_8_ & 0x3f);
            }
            pSVar59 = local_c40;
          } while (uVar57 != 0);
        }
        auVar122 = ZEXT1664(auVar119);
        auVar117 = ZEXT1664(auVar114);
        auVar113 = ZEXT1664(auVar109);
        auVar98 = ZEXT1664(auVar93);
        auVar92 = ZEXT1664(auVar87);
        local_c20 = local_c20 + 1;
      } while (local_c20 != uVar55 - 8);
    }
LAB_00518037:
    bVar67 = puVar62 != &local_800;
    if (!bVar67) {
      return bVar67;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }